

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::Module::removeFunctions(Module *this,function<bool_(wasm::Function_*)> *pred)

{
  function<bool_(wasm::Function_*)> local_38;
  function<bool_(wasm::Function_*)> *local_18;
  function<bool_(wasm::Function_*)> *pred_local;
  Module *this_local;
  
  local_18 = pred;
  pred_local = (function<bool_(wasm::Function_*)> *)this;
  std::function<bool_(wasm::Function_*)>::function(&local_38,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>,std::unordered_map<wasm::Name,wasm::Function*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Function*>>>,wasm::Function>
            (&this->functions,&this->functionsMap,&local_38);
  std::function<bool_(wasm::Function_*)>::~function(&local_38);
  return;
}

Assistant:

void Module::removeFunctions(std::function<bool(Function*)> pred) {
  removeModuleElements(functions, functionsMap, pred);
}